

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
efsw::FileWatcherGeneric::directories_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FileWatcherGeneric *this)

{
  pointer ppWVar1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Mutex::lock(&this->mWatchesLock);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)(this->mWatches).
                  super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mWatches).
                  super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  for (ppWVar1 = (this->mWatches).
                 super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppWVar1 !=
      (this->mWatches).
      super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppWVar1 = ppWVar1 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&((*ppWVar1)->super_Watcher).Directory);
  }
  Mutex::unlock(&this->mWatchesLock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> FileWatcherGeneric::directories() {
	std::vector<std::string> dirs;

	Lock lock( mWatchesLock );

	dirs.reserve( mWatches.size() );

	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		dirs.push_back( ( *it )->Directory );
	}

	return dirs;
}